

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

int __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::bind
          (reactive_socket_service<asio::ip::tcp> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  data_type *pdVar2;
  sockaddr *__addr_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  error_code *ec_local;
  endpoint_type *endpoint_local;
  implementation_type *impl_local;
  reactive_socket_service<asio::ip::tcp> *this_local;
  
  uVar1 = *(uint *)CONCAT44(in_register_00000034,__fd);
  pdVar2 = ip::basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)__addr);
  __addr_00 = (sockaddr *)
              ip::basic_endpoint<asio::ip::tcp>::size((basic_endpoint<asio::ip::tcp> *)__addr);
  socket_ops::bind((socket_ops *)(ulong)uVar1,(int)pdVar2,__addr_00,__len);
  this_local._0_4_ = (int)*(undefined8 *)CONCAT44(in_register_0000000c,__len);
  return (int)this_local;
}

Assistant:

asio::error_code bind(implementation_type& impl,
      const endpoint_type& endpoint, asio::error_code& ec)
  {
    socket_ops::bind(impl.socket_, endpoint.data(), endpoint.size(), ec);
    return ec;
  }